

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O2

bool __thiscall cmExportSet::Compute(cmExportSet *this,cmLocalGenerator *lg)

{
  pointer puVar1;
  pointer pbVar2;
  pointer puVar3;
  bool bVar4;
  pointer puVar5;
  cmGeneratorTarget *pcVar6;
  long lVar7;
  long lVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  cmLocalGenerator *local_38;
  
  puVar1 = (this->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar1) break;
    pcVar6 = cmLocalGenerator::FindGeneratorTargetToUse
                       (lg,&((puVar5->_M_t).
                             super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                             .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                            TargetName);
    ((puVar5->_M_t).super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
     .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
     super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target = pcVar6;
    cmTarget::GetAllInterfaceFileSets_abi_cxx11_
              (&local_58,
               ((puVar5->_M_t).
                super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target->Target);
    pbVar2 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    __it._M_current =
         local_58.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40 = puVar5;
    local_38 = lg;
    for (lVar8 = lVar7 >> 7; 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it);
      _Var9._M_current = __it._M_current;
      if (bVar4) goto LAB_00297445;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it._M_current + 1);
      _Var9._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_00297445;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it._M_current + 2);
      _Var9._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_00297445;
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it._M_current + 3);
      _Var9._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_00297445;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -0x80;
    }
    lVar7 = lVar7 >> 5;
    if (lVar7 == 1) {
LAB_0029742f:
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it);
      _Var9._M_current = __it._M_current;
      if (!bVar4) {
        _Var9._M_current = pbVar2;
      }
    }
    else if (lVar7 == 2) {
LAB_0029741c:
      bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
              operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                         __it);
      _Var9._M_current = __it._M_current;
      if (!bVar4) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0029742f;
      }
    }
    else {
      _Var9._M_current = pbVar2;
      if ((lVar7 == 3) &&
         (bVar4 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it), _Var9._M_current = __it._M_current, !bVar4)) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0029741c;
      }
    }
LAB_00297445:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    puVar3 = puVar5 + 1;
  } while (_Var9._M_current == pbVar2);
  return puVar5 == puVar1;
}

Assistant:

bool cmExportSet::Compute(cmLocalGenerator* lg)
{
  for (std::unique_ptr<cmTargetExport>& tgtExport : this->TargetExports) {
    tgtExport->Target = lg->FindGeneratorTargetToUse(tgtExport->TargetName);

    auto const interfaceFileSets =
      tgtExport->Target->Target->GetAllInterfaceFileSets();
    auto const fileSetInTargetExport =
      [&tgtExport, lg](const std::string& fileSetName) -> bool {
      auto* fileSet = tgtExport->Target->Target->GetFileSet(fileSetName);

      if (!tgtExport->FileSetGenerators.count(fileSet)) {
        lg->IssueMessage(MessageType::FATAL_ERROR,
                         cmStrCat("File set \"", fileSetName,
                                  "\" is listed in interface file sets of ",
                                  tgtExport->Target->GetName(),
                                  " but has not been exported"));
        return false;
      }
      return true;
    };

    if (!std::all_of(interfaceFileSets.begin(), interfaceFileSets.end(),
                     fileSetInTargetExport)) {
      return false;
    }
  }

  return true;
}